

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O0

void rlglInit(int width,int height)

{
  long lVar1;
  undefined1 local_13c [64];
  undefined1 local_fc [64];
  undefined1 local_bc [64];
  undefined1 local_7c [64];
  int local_3c;
  int iStack_38;
  int i;
  VertexBuffer *local_30;
  DrawCall *local_28;
  int local_20;
  float fStack_1c;
  undefined4 local_14;
  int local_10;
  uchar pixels [4];
  int height_local;
  int width_local;
  
  local_14 = 0xffffffff;
  local_10 = height;
  pixels = (uchar  [4])width;
  RLGL.State.defaultTextureId = rlLoadTexture(&local_14,1,1,7,1);
  if (RLGL.State.defaultTextureId == 0) {
    TraceLog(4,"TEXTURE: Failed to load default texture");
  }
  else {
    TraceLog(3,"TEXTURE: [ID %i] Default texture loaded successfully",
             (ulong)RLGL.State.defaultTextureId);
  }
  rlLoadShaderDefault();
  RLGL.State.currentShader.id = RLGL.State.defaultShader.id;
  RLGL.State.currentShader._4_4_ = RLGL.State.defaultShader._4_4_;
  RLGL.State.currentShader.locs = RLGL.State.defaultShader.locs;
  rlLoadRenderBatch((RenderBatch *)&stack0xffffffffffffffc8,1,0x2000);
  RLGL.defaultBatch.buffersCount = iStack_38;
  RLGL.defaultBatch.currentBuffer = i;
  RLGL.defaultBatch.vertexBuffer = local_30;
  RLGL.defaultBatch.draws = local_28;
  RLGL.defaultBatch.drawsCounter = local_20;
  RLGL.defaultBatch.currentDepth = fStack_1c;
  RLGL.currentBatch = &RLGL.defaultBatch;
  for (local_3c = 0; local_3c < 0x20; local_3c = local_3c + 1) {
    lVar1 = (long)local_3c;
    MatrixIdentity();
    memcpy(RLGL.State.stack + lVar1,local_7c,0x40);
  }
  MatrixIdentity();
  memcpy(&RLGL.State.transform,local_bc,0x40);
  MatrixIdentity();
  memcpy(&RLGL.State.projection,local_fc,0x40);
  MatrixIdentity();
  memcpy(&RLGL.State.modelview,local_13c,0x40);
  RLGL.State.currentMatrix = &RLGL.State.modelview;
  (*glad_glDepthFunc)(0x203);
  (*glad_glDisable)(0xb71);
  (*glad_glBlendFunc)(0x302,0x303);
  (*glad_glEnable)(0xbe2);
  (*glad_glCullFace)(0x405);
  (*glad_glFrontFace)(0x901);
  (*glad_glEnable)(0xb44);
  (*glad_glEnable)(0x884f);
  RLGL.State.framebufferWidth._0_1_ = pixels[0];
  RLGL.State.framebufferWidth._1_1_ = pixels[1];
  RLGL.State.framebufferWidth._2_1_ = pixels[2];
  RLGL.State.framebufferWidth._3_1_ = pixels[3];
  RLGL.State.framebufferHeight = local_10;
  TraceLog(3,"RLGL: Default OpenGL state initialized successfully");
  (*glad_glClearColor)(0.0,0.0,0.0,1.0);
  (*glad_glClearDepth)(1.0);
  (*glad_glClear)(0x4100);
  return;
}

Assistant:

void rlglInit(int width, int height)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    // Init default white texture
    unsigned char pixels[4] = { 255, 255, 255, 255 };   // 1 pixel RGBA (4 bytes)
    RLGL.State.defaultTextureId = rlLoadTexture(pixels, 1, 1, PIXELFORMAT_UNCOMPRESSED_R8G8B8A8, 1);

    if (RLGL.State.defaultTextureId != 0) TRACELOG(LOG_INFO, "TEXTURE: [ID %i] Default texture loaded successfully", RLGL.State.defaultTextureId);
    else TRACELOG(LOG_WARNING, "TEXTURE: Failed to load default texture");

    // Init default Shader (customized for GL 3.3 and ES2)
    rlLoadShaderDefault(); // RLGL.State.defaultShader
    RLGL.State.currentShader = RLGL.State.defaultShader;

    // Init default vertex arrays buffers
    RLGL.defaultBatch = rlLoadRenderBatch(DEFAULT_BATCH_BUFFERS, DEFAULT_BATCH_BUFFER_ELEMENTS);
    RLGL.currentBatch = &RLGL.defaultBatch;

    // Init stack matrices (emulating OpenGL 1.1)
    for (int i = 0; i < MAX_MATRIX_STACK_SIZE; i++) RLGL.State.stack[i] = MatrixIdentity();

    // Init internal matrices
    RLGL.State.transform = MatrixIdentity();
    RLGL.State.projection = MatrixIdentity();
    RLGL.State.modelview = MatrixIdentity();
    RLGL.State.currentMatrix = &RLGL.State.modelview;
#endif  // GRAPHICS_API_OPENGL_33 || GRAPHICS_API_OPENGL_ES2

    // Initialize OpenGL default states
    //----------------------------------------------------------
    // Init state: Depth test
    glDepthFunc(GL_LEQUAL);                                 // Type of depth testing to apply
    glDisable(GL_DEPTH_TEST);                               // Disable depth testing for 2D (only used for 3D)

    // Init state: Blending mode
    glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);      // Color blending function (how colors are mixed)
    glEnable(GL_BLEND);                                     // Enable color blending (required to work with transparencies)

    // Init state: Culling
    // NOTE: All shapes/models triangles are drawn CCW
    glCullFace(GL_BACK);                                    // Cull the back face (default)
    glFrontFace(GL_CCW);                                    // Front face are defined counter clockwise (default)
    glEnable(GL_CULL_FACE);                                 // Enable backface culling

    // Init state: Cubemap seamless
#if defined(GRAPHICS_API_OPENGL_33)
    glEnable(GL_TEXTURE_CUBE_MAP_SEAMLESS);                 // Seamless cubemaps (not supported on OpenGL ES 2.0)
#endif

#if defined(GRAPHICS_API_OPENGL_11)
    // Init state: Color hints (deprecated in OpenGL 3.0+)
    glHint(GL_PERSPECTIVE_CORRECTION_HINT, GL_NICEST);      // Improve quality of color and texture coordinate interpolation
    glShadeModel(GL_SMOOTH);                                // Smooth shading between vertex (vertex colors interpolation)
#endif

#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    // Store screen size into global variables
    RLGL.State.framebufferWidth = width;
    RLGL.State.framebufferHeight = height;

    TRACELOG(LOG_INFO, "RLGL: Default OpenGL state initialized successfully");
    //----------------------------------------------------------
#endif

    // Init state: Color/Depth buffers clear
    glClearColor(0.0f, 0.0f, 0.0f, 1.0f);                   // Set clear color (black)
    glClearDepth(1.0f);                                     // Set clear depth value (default)
    glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);     // Clear color and depth buffers (depth buffer required for 3D)
}